

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase710::run(TestCase710 *this)

{
  WirePointer *pWVar1;
  char cVar2;
  uint local_30c;
  Reader reader;
  Fault f_1;
  StructDataBitCount local_2b8;
  ListElementCount local_29c;
  Builder root;
  BuilderFor<capnp::List<capnproto_test::capnp::test::TestLists::Struct1c>_> list;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAnyPointer>
            (&root,&builder.super_MessageBuilder);
  reader._reader.segment = &(root._builder.segment)->super_SegmentReader;
  reader._reader.capTable = &(root._builder.capTable)->super_CapTableReader;
  reader._reader.data = root._builder.pointers;
  AnyPointer::Builder::
  initAs<capnp::List<capnproto_test::capnp::test::TestLists::Struct1c,(capnp::Kind)3>>
            (&list,(Builder *)&reader,4);
  ListBuilder::getStructElement((StructBuilder *)&reader,&list.builder,0);
  *(byte *)reader._reader.data = *reader._reader.data | 1;
  ListBuilder::getStructElement((StructBuilder *)&reader,&list.builder,1);
  *(byte *)reader._reader.data = *reader._reader.data & 0xfe;
  ListBuilder::getStructElement((StructBuilder *)&reader,&list.builder,2);
  *(byte *)reader._reader.data = *reader._reader.data | 1;
  ListBuilder::getStructElement((StructBuilder *)&reader,&list.builder,3);
  *(byte *)reader._reader.data = *reader._reader.data | 1;
  reader._reader.segment = (SegmentReader *)&PTR_run_00391790;
  reader._reader.capTable = (CapTableReader *)&root;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&list,(Runnable *)&reader);
  cVar2 = (char)list.builder.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&list);
  if ((cVar2 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x2d2,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
              );
  }
  reader._reader.segment = &(root._builder.segment)->super_SegmentReader;
  reader._reader.capTable = &(root._builder.capTable)->super_CapTableReader;
  reader._reader.data = root._builder.pointers;
  AnyPointer::Builder::
  getAs<capnp::List<capnproto_test::capnp::test::TestLists::Struct1,(capnp::Kind)3>>
            ((BuilderFor<capnp::List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>_>
              *)&list,(Builder *)&reader);
  if (list.builder.elementCount != 4) {
    f_1.exception._0_4_ = 4;
    local_30c = list.builder.elementCount;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              ((Fault *)&reader,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x2d6,FAILED,"(4u) == (l.size())","4u, l.size()",(uint *)&f_1,&local_30c);
    kj::_::Debug::Fault::fatal((Fault *)&reader);
  }
  ListBuilder::getStructElement((StructBuilder *)&reader,&list.builder,0);
  if (((*reader._reader.data & 1) == 0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[29]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x2d7,ERROR,"\"failed: expected \" \"l[0].getF()\"",
               (char (*) [29])"failed: expected l[0].getF()");
  }
  ListBuilder::getStructElement((StructBuilder *)&reader,&list.builder,1);
  if (((*reader._reader.data & 1) != 0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[32]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x2d8,ERROR,"\"failed: expected \" \"!(l[1].getF())\"",
               (char (*) [32])"failed: expected !(l[1].getF())");
  }
  ListBuilder::getStructElement((StructBuilder *)&reader,&list.builder,2);
  if (((*reader._reader.data & 1) == 0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[29]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x2d9,ERROR,"\"failed: expected \" \"l[2].getF()\"",
               (char (*) [29])"failed: expected l[2].getF()");
  }
  ListBuilder::getStructElement((StructBuilder *)&reader,&list.builder,3);
  if (((*reader._reader.data & 1) == 0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[29]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x2da,ERROR,"\"failed: expected \" \"l[3].getF()\"",
               (char (*) [29])"failed: expected l[3].getF()");
  }
  StructBuilder::asReader(&root._builder);
  f_1.exception = (Exception *)&PTR_run_003917c0;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&list,(Runnable *)&f_1);
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&list);
  if (((char)list.builder.segment == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x2df,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
              );
  }
  pWVar1 = (WirePointer *)0x0;
  if (reader._reader.pointerCount != 0) {
    pWVar1 = reader._reader.pointers;
  }
  f_1.exception._0_4_ = 0;
  f_1.exception._4_4_ = 0;
  if (reader._reader.pointerCount != 0) {
    f_1.exception._0_4_ = reader._reader.segment._0_4_;
    f_1.exception._4_4_ = reader._reader.segment._4_4_;
  }
  AnyPointer::Reader::
  getAs<capnp::List<capnproto_test::capnp::test::TestLists::Struct1,(capnp::Kind)3>>
            ((ReaderFor<capnp::List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>_>
              *)&list,(Reader *)&f_1);
  if (list.builder.elementCount != 4) {
    local_30c = 4;
    local_29c = list.builder.elementCount;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&f_1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x2e3,FAILED,"(4u) == (l.size())","4u, l.size()",&local_30c,&local_29c);
    kj::_::Debug::Fault::fatal(&f_1);
  }
  ListReader::getStructElement((StructReader *)&f_1,(ListReader *)&list,0);
  if (((local_2b8 == 0) || (((pWVar1->offsetAndKind).value & 1) == 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[29]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x2e4,ERROR,"\"failed: expected \" \"l[0].getF()\"",
               (char (*) [29])"failed: expected l[0].getF()");
  }
  ListReader::getStructElement((StructReader *)&f_1,(ListReader *)&list,1);
  if (((local_2b8 != 0) && (((pWVar1->offsetAndKind).value & 1) != 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[32]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x2e5,ERROR,"\"failed: expected \" \"!(l[1].getF())\"",
               (char (*) [32])"failed: expected !(l[1].getF())");
  }
  ListReader::getStructElement((StructReader *)&f_1,(ListReader *)&list,2);
  if (((local_2b8 == 0) || (((pWVar1->offsetAndKind).value & 1) == 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[29]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x2e6,ERROR,"\"failed: expected \" \"l[2].getF()\"",
               (char (*) [29])"failed: expected l[2].getF()");
  }
  ListReader::getStructElement((StructReader *)&f_1,(ListReader *)&list,3);
  if (((local_2b8 == 0) || (((pWVar1->offsetAndKind).value & 1) == 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[29]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x2e7,ERROR,"\"failed: expected \" \"l[3].getF()\"",
               (char (*) [29])"failed: expected l[3].getF()");
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Encoding, BitListDowngradeFromStruct) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestAnyPointer>();

  {
    auto list = root.getAnyPointerField().initAs<List<test::TestLists::Struct1c>>(4);
    list[0].setF(true);
    list[1].setF(false);
    list[2].setF(true);
    list[3].setF(true);
  }

  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());

  {
    auto l = root.getAnyPointerField().getAs<List<test::TestLists::Struct1>>();
    ASSERT_EQ(4u, l.size());
    EXPECT_TRUE(l[0].getF());
    EXPECT_FALSE(l[1].getF());
    EXPECT_TRUE(l[2].getF());
    EXPECT_TRUE(l[3].getF());
  }

  auto reader = root.asReader();

  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());

  {
    auto l = reader.getAnyPointerField().getAs<List<test::TestLists::Struct1>>();
    ASSERT_EQ(4u, l.size());
    EXPECT_TRUE(l[0].getF());
    EXPECT_FALSE(l[1].getF());
    EXPECT_TRUE(l[2].getF());
    EXPECT_TRUE(l[3].getF());
  }
}